

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O3

void Js::CompoundString::AppendGeneric<Js::CompoundString>
               (JavascriptString *s,CompoundString *toString,bool appendChars)

{
  char16 c;
  code *pcVar1;
  bool bVar2;
  charcount_t appendCharLength;
  undefined4 *puVar3;
  char16 *pcVar4;
  char16 *pcVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ec,"(s)","s");
    if (!bVar2) goto LAB_00b2c112;
    *puVar3 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ed,"(toString)","toString");
    if (!bVar2) goto LAB_00b2c112;
    *puVar3 = 0;
  }
  pcVar4 = JavascriptString::UnsafeGetBuffer((JavascriptString *)toString);
  if (pcVar4 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ee,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00b2c112;
    *puVar3 = 0;
  }
  if (toString->ownsLastBlock == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ef,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00b2c112;
    *puVar3 = 0;
  }
  if ((appendChars) && (toString->directCharLength != 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3f0,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) {
LAB_00b2c112:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  appendCharLength = JavascriptString::GetLength(s);
  if (appendCharLength == 0) {
    return;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,StringConcatPhase);
  if (bVar2) {
    pcVar4 = JavascriptString::UnsafeGetBuffer(s);
    pcVar7 = L"";
    pcVar5 = L"";
    if (pcVar4 != (char16 *)0x0) {
      pcVar5 = JavascriptString::GetString(s);
    }
    pcVar4 = JavascriptString::UnsafeGetBuffer(s);
    if (pcVar4 == (char16 *)0x0) {
      pcVar7 = L"...";
    }
    if (8 < appendCharLength) {
      pcVar7 = L"...";
    }
    pcVar6 = L"false";
    if (appendChars) {
      pcVar6 = L"true";
    }
    Output::Print(L"CompoundString::AppendGeneric(JavascriptString *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"
                  ,pcVar5,pcVar7,(ulong)appendCharLength,pcVar6);
    Output::Flush();
  }
  if (appendChars) {
    if (appendCharLength != 1) {
      pcVar4 = GetAppendStringBuffer(toString,s);
      bVar2 = TryAppendGeneric<Js::CompoundString>(pcVar4,appendCharLength,toString);
LAB_00b2c044:
      if (bVar2 != false) {
        return;
      }
      AppendSlow(toString,pcVar4,appendCharLength);
      return;
    }
LAB_00b2c09b:
    pcVar4 = GetAppendStringBuffer(toString,s);
    c = *pcVar4;
    bVar2 = TryAppendGeneric<Js::CompoundString>(c,toString);
    if (!bVar2) {
      AppendSlow(toString,c);
      return;
    }
  }
  else {
    if (toString->directCharLength == 0xffffffff) {
      if (appendCharLength == 1) goto LAB_00b2c09b;
      if (appendCharLength < 9) {
        pcVar4 = GetAppendStringBuffer(toString,s);
        bVar2 = TryAppendFewCharsGeneric<Js::CompoundString>(pcVar4,appendCharLength,toString);
        goto LAB_00b2c044;
      }
      SwitchToPointerMode(toString);
    }
    bVar2 = TryAppendGeneric<Js::CompoundString>(s,appendCharLength,toString);
    if (!bVar2) {
      AppendSlow(toString,s);
      return;
    }
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        JavascriptString *const s,
        String *const toString,
        const bool appendChars)
    {
        Assert(s);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        const CharCount appendCharLength = s->GetLength();
        if(appendCharLength == 0)
            return;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(JavascriptString *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"),
                s->IsFinalized() ? s->GetString() : _u(""),
                !s->IsFinalized() || appendCharLength > 8 ? _u("...") : _u(""),
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendCharLength == 1)
            {
                const char16 c = toString->GetAppendStringBuffer(s)[0];
                if(TryAppendGeneric(c, toString))
                    return;
                toString->AppendSlow(c);
                return;
            }

            if(appendChars || Block::ShouldAppendChars(appendCharLength))
            {
                const char16 *const appendBuffer = toString->GetAppendStringBuffer(s);
                if(appendChars
                        ? TryAppendGeneric(appendBuffer, appendCharLength, toString)
                        : TryAppendFewCharsGeneric(appendBuffer, appendCharLength, toString))
                {
                    return;
                }
                toString->AppendSlow(appendBuffer, appendCharLength);
                return;
            }

            toString->SwitchToPointerMode();
        }

        if(TryAppendGeneric(s, appendCharLength, toString))
            return;
        toString->AppendSlow(s);
    }